

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::reparse_expr(Plotter *this,size_t idx)

{
  Function *func;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expr *this_00;
  Expr *pEVar2;
  pointer pFVar3;
  pointer pcVar4;
  pointer pAVar5;
  pointer pEVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint64_t uVar11;
  long lVar12;
  uint32_t *puVar13;
  long *plVar14;
  char cVar15;
  uint uVar16;
  size_type *psVar17;
  char *pcVar18;
  char *extraout_RDX;
  char *extraout_RDX_00;
  uint uVar19;
  _Alloc_hider _Var20;
  undefined4 uVar21;
  Expr *point_expr;
  pointer this_01;
  size_t idx_00;
  ulong uVar22;
  string *expr;
  Environment *pEVar23;
  string_view expr_00;
  string_view expr_01;
  initializer_list<unsigned_long> __l;
  string funname;
  string arg;
  string lhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bindings;
  uint64_t addr;
  string rhs;
  string local_140;
  Environment *local_120;
  string *local_118;
  uint local_10c;
  string local_108;
  string local_e8;
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *local_c8;
  uint32_t *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  ulong local_58;
  size_t local_50;
  Expr local_48;
  
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_50 = idx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"x","");
  pEVar23 = &this->env;
  uVar11 = Environment::addr_of(pEVar23,&local_e8,false);
  this->x_var = (uint32_t)uVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"y","");
  uVar11 = Environment::addr_of(pEVar23,&local_e8,false);
  this->y_var = (uint32_t)uVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"t","");
  uVar11 = Environment::addr_of(pEVar23,&local_e8,false);
  this->t_var = (uint32_t)uVar11;
  local_120 = pEVar23;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  sVar7 = local_50;
  pFVar3 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (this->func_error)._M_dataplus._M_p;
  func = pFVar3 + local_50;
  (this->func_error)._M_string_length = 0;
  *pcVar4 = '\0';
  local_c8 = &pFVar3[local_50].exprs;
  std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::_M_erase_at_end
            (local_c8,(local_c8->super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>).
                      _M_impl.super__Vector_impl_data._M_start);
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (this->use_latex == true) {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    nivalis::latex_to_nivalis(&local_140,&pFVar3[sVar7].expr_str);
  }
  else {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pcVar4 = (func->expr_str)._M_dataplus._M_p;
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar4,pcVar4 + (func->expr_str)._M_string_length);
  }
  iVar10 = anon_unknown_10::detect_func_type(&local_140,&local_e8,&local_78);
  func->type = iVar10;
  paVar1 = &local_140.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_118 = &this->func_error;
  local_10c = func->type & 0xfffffff8;
  bVar8 = false;
  switch((uint)func->type >> 3) {
  case 0:
  case 1:
  case 3:
    if (local_78._M_string_length == 1) {
      uVar16 = func->type & 0xfffffff8;
      if (uVar16 == 0) {
        cVar15 = 'y';
      }
      else if (uVar16 == 0x18) {
        cVar15 = 'r';
      }
      else if (uVar16 == 8) {
        cVar15 = 'x';
      }
      else {
        cVar15 = '\0';
      }
      expr = &local_e8;
      if (*local_78._M_dataplus._M_p != cVar15) goto LAB_0012890d;
    }
    else {
LAB_0012890d:
      expr = &local_78;
    }
    parse((Expr *)&local_140,expr,local_120,true,true,0,local_118);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&(func->expr).ast);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar22 = local_140.field_2._M_allocated_capacity - (long)local_140._M_dataplus._M_p;
      _Var20._M_p = local_140._M_dataplus._M_p;
LAB_00128b6e:
      operator_delete(_Var20._M_p,uVar22);
    }
    goto LAB_00128b73;
  case 2:
    std::operator+(&local_b8,"(",&local_e8);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_98.field_2._M_allocated_capacity = *psVar17;
      local_98.field_2._8_8_ = plVar14[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar17;
      local_98._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_98._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108.field_2._8_8_ = plVar14[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar17;
      local_108._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_108._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_108);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_140.field_2._M_allocated_capacity = *psVar17;
      local_140.field_2._8_8_ = plVar14[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar17;
      local_140._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_140._M_string_length = *(size_type *)(plVar14 + 1);
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    parse(&local_48,&local_140,local_120,true,true,0,local_118);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&(func->expr).ast);
    if (local_48.ast.
        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar22 = local_b8.field_2._M_allocated_capacity + 1;
      _Var20._M_p = local_b8._M_dataplus._M_p;
      goto LAB_00128b6e;
    }
LAB_00128b73:
    bVar8 = false;
    break;
  case 8:
    lVar12 = std::__cxx11::string::find((char)&local_e8,0x28);
    std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_e8);
    util::trim(&local_140);
    uVar22 = lVar12 + 1;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    if (uVar22 < local_e8._M_string_length - 1) {
      lVar12 = 0;
      local_c8 = (vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)0x0;
      local_c0 = (uint32_t *)((ulong)local_c0 & 0xffffffff00000000);
      do {
        cVar15 = local_e8._M_dataplus._M_p[uVar22];
        if (cVar15 == ',') {
          bVar8 = true;
          if (lVar12 == 0) {
            std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_e8);
            util::trim(&local_108);
            expr_00._M_str = extraout_RDX;
            expr_00._M_len = (size_t)local_108._M_dataplus._M_p;
            bVar8 = util::is_varname((util *)local_108._M_string_length,expr_00);
            uVar21 = (int)CONCAT71((int7)((ulong)&local_108 >> 8),1);
            if (bVar8) {
              local_98._M_dataplus._M_p = (pointer)Environment::addr_of(local_120,&local_108,false);
              if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                           (iterator)local_b8._M_string_length,(unsigned_long *)&local_98);
              }
              else {
                *(pointer *)local_b8._M_string_length = local_98._M_dataplus._M_p;
                local_b8._M_string_length = local_b8._M_string_length + 8;
              }
              uVar21 = (uint)local_c0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            local_c0 = (uint32_t *)CONCAT44(local_c0._4_4_,uVar21);
            lVar12 = 0;
          }
        }
        else {
          if (cVar15 == ')') {
            lVar12 = lVar12 + -1;
          }
          else if (cVar15 == '(') {
            lVar12 = lVar12 + 1;
          }
          else {
            iVar10 = isspace((int)cVar15);
            local_c8 = (vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                       ((long)&(local_c8->
                               super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>).
                               _M_impl.super__Vector_impl_data._M_start + (ulong)(iVar10 == 0));
          }
          bVar8 = true;
        }
      } while ((bVar8 != false) && (uVar22 = uVar22 + 1, uVar22 < local_e8._M_string_length - 1));
      bVar8 = local_c8 == (vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)0x0;
      uVar16 = (uint)local_c0;
    }
    else {
      bVar8 = true;
      uVar16 = 0;
    }
    pEVar23 = local_120;
    if (((uVar16 & 1) == 0) && (!bVar8)) {
      std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_e8);
      util::trim(&local_140);
      pEVar23 = local_120;
      expr_01._M_str = extraout_RDX_00;
      expr_01._M_len = (size_t)local_108._M_dataplus._M_p;
      bVar8 = util::is_varname((util *)local_108._M_string_length,expr_01);
      uVar19 = 1;
      if (bVar8) {
        local_98._M_dataplus._M_p = (pointer)Environment::addr_of(pEVar23,&local_108,false);
        uVar19 = uVar16;
        if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                     (iterator)local_b8._M_string_length,(unsigned_long *)&local_98);
        }
        else {
          *(pointer *)local_b8._M_string_length = local_98._M_dataplus._M_p;
          local_b8._M_string_length = local_b8._M_string_length + 8;
        }
      }
      uVar16 = uVar19;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    if ((uVar16 & 1) == 0) {
      parse((Expr *)&local_108,&local_78,pEVar23,true,true,0,local_118);
      uVar11 = Environment::addr_of_func(pEVar23,&local_140);
      bVar8 = uVar11 == 0xffffffffffffffff;
      Environment::def_func
                (pEVar23,&local_140,(Expr *)&local_108,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
      if ((this->env).error_msg._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_108._M_dataplus._M_p,
                        local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
      }
    }
    else {
      std::operator+(&local_98,"Invalid argument name in function definition ",&local_e8);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_98);
      psVar17 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_108.field_2._M_allocated_capacity = *psVar17;
        local_108.field_2._8_8_ = plVar14[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar17;
        local_108._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_108._M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_118,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_b8._M_dataplus._M_p,
                      local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0x10:
  case 0x11:
    bVar8 = anon_unknown_10::parse_polyline_expr
                      (&local_e8,func,local_120,this->x_var,this->y_var,this->t_var,local_118);
    if ((local_10c == 0x88) &&
       ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x60)) {
      std::__cxx11::string::_M_replace
                ((ulong)local_118,0,(char *)(this->func_error)._M_string_length,0x21c010);
    }
    break;
  case 0x12:
    lVar12 = std::__cxx11::string::find((char)&local_e8,0x40);
    if (lVar12 == -1) {
      pcVar18 = "%circ radius/center not specified. Syntax: %circ radius @ (cenx, ceny)\n";
    }
    else {
      std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_e8);
      pEVar23 = local_120;
      anon_unknown_10::parse_polyline_expr
                (&local_140,func,local_120,this->x_var,this->y_var,this->t_var,local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_e8);
      parse((Expr *)&local_108,&local_140,pEVar23,true,true,0,local_118);
      std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::emplace_back<nivalis::Expr>
                (local_c8,(Expr *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_108._M_dataplus._M_p,
                        local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x48) goto LAB_00128b73;
      pcVar18 = "Illegal %circ. Syntax: %circ radius @ (cenx, ceny)\n";
    }
    bVar8 = false;
    std::__cxx11::string::_M_replace
              ((ulong)local_118,0,(char *)(this->func_error)._M_string_length,(ulong)pcVar18);
    break;
  case 0x13:
    lVar12 = std::__cxx11::string::find((char)&local_e8,0x40);
    if (lVar12 == -1) {
      pcVar18 = "%ellipse radius/center not specified. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
    }
    else {
      std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_e8);
      pEVar23 = local_120;
      anon_unknown_10::parse_polyline_expr
                (&local_140,func,local_120,this->x_var,this->y_var,this->t_var,local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_e8);
      anon_unknown_10::parse_polyline_expr
                (&local_140,func,pEVar23,this->x_var,this->y_var,this->t_var,local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x60) goto LAB_00128b73;
      pcVar18 = "Illegal %ellipse. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
    }
    bVar8 = false;
    std::__cxx11::string::_M_replace
              ((ulong)local_118,0,(char *)(this->func_error)._M_string_length,(ulong)pcVar18);
    break;
  case 0x14:
    lVar12 = std::__cxx11::string::find((char)&local_e8,0x40);
    if (lVar12 == -1) {
      pcVar18 = "%text text/position not specified. Syntax: %text text @ (x, y)\n";
    }
    else {
      std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_e8);
      anon_unknown_10::parse_polyline_expr
                (&local_140,func,local_120,this->x_var,this->y_var,this->t_var,local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_e8);
      std::__cxx11::string::operator=((string *)&func->str,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      util::trim(&func->str);
      if ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x30) goto LAB_00128b73;
      pcVar18 = "Illegal %text. Syntax: %text text @ (x, y)\n";
    }
    bVar8 = false;
    std::__cxx11::string::_M_replace
              ((ulong)local_118,0,(char *)(this->func_error)._M_string_length,(ulong)pcVar18);
  }
  this_00 = &func->expr;
  bVar9 = Expr::is_null(this_00);
  local_c0 = &this->x_var;
  local_c8 = (vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)&this->y_var;
  if (bVar9) {
    Expr::ASTNode::ASTNode((ASTNode *)&local_140,null);
    pAVar5 = (func->diff).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)pAVar5 = local_140._M_dataplus._M_p;
    pAVar5->field_1 = (anon_union_8_3_343d95dd_for_ASTNode_1)local_140._M_string_length;
  }
  else if (((local_10c != 0x28) && (local_10c != 0x40)) &&
          ((Expr::optimize(this_00,5), puVar13 = (uint32_t *)local_c8, local_10c == 8 ||
           (puVar13 = local_c0, local_10c == 0)))) {
    local_58 = (ulong)*puVar13;
    Expr::diff((Expr *)&local_140,this_00,local_58,local_120);
    pEVar2 = &func->diff;
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&pEVar2->ast);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_140._M_dataplus._M_p,
                      local_140.field_2._M_allocated_capacity - (long)local_140._M_dataplus._M_p);
    }
    bVar9 = Expr::is_null(pEVar2);
    if (bVar9) {
      Expr::ASTNode::ASTNode((ASTNode *)&local_140,null);
      pAVar5 = (func->ddiff).ast.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)pAVar5 = local_140._M_dataplus._M_p;
      pAVar5->field_1 = (anon_union_8_3_343d95dd_for_ASTNode_1)local_140._M_string_length;
    }
    else {
      Expr::diff((Expr *)&local_140,pEVar2,local_58,local_120);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
                (&(func->ddiff).ast,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_140._M_dataplus._M_p,
                        local_140.field_2._M_allocated_capacity - (long)local_140._M_dataplus._M_p);
      }
    }
    Expr::constant((Expr *)&local_108,1.0);
    Expr::operator/((Expr *)&local_140,(Expr *)&local_108,this_00);
    pEVar2 = &func->recip;
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&pEVar2->ast,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_140._M_dataplus._M_p,
                      local_140.field_2._M_allocated_capacity - (long)local_140._M_dataplus._M_p);
    }
    uVar22 = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    Expr::optimize(pEVar2,5);
    Expr::diff((Expr *)&local_140,pEVar2,uVar22,local_120);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&(func->drecip).ast,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_140._M_dataplus._M_p,
                      local_140.field_2._M_allocated_capacity - (long)local_140._M_dataplus._M_p);
    }
  }
  pEVar6 = (func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_01 = (func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_01 != pEVar6; this_01 = this_01 + 1)
  {
    Expr::optimize(this_01,5);
  }
  if ((local_10c == 0) || (local_10c == 8)) {
    uVar11 = Environment::addr_of_func(local_120,&func->name);
    bVar9 = true;
    if (uVar11 != 0xffffffffffffffff) {
      bVar9 = bVar8;
    }
    bVar8 = bVar9;
    puVar13 = local_c0;
    if (local_10c == 8) {
      puVar13 = (uint32_t *)local_c8;
    }
    local_108._M_dataplus._M_p = (pointer)(ulong)*puVar13;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_108;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140,__l,
               (allocator_type *)&local_98);
    Environment::def_func
              (local_120,&func->name,this_00,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_140._M_dataplus._M_p,
                      local_140.field_2._M_allocated_capacity - (long)local_140._M_dataplus._M_p);
    }
    if ((this->env).error_msg._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)local_118);
    }
  }
  else if ((local_10c != 0x40) &&
          (uVar11 = Environment::addr_of_func(local_120,&func->name), uVar11 != 0xffffffffffffffff))
  {
    bVar8 = true;
    Environment::del_func(local_120,&func->name);
  }
  sVar7 = local_50;
  if ((bVar8 != false) &&
     ((this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    idx_00 = 0;
    do {
      if (sVar7 != idx_00) {
        reparse_expr(this,idx_00);
      }
      idx_00 = idx_00 + 1;
    } while (idx_00 < (ulong)(((long)(this->funcs).
                                     super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->funcs).
                                     super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x79435e50d79435e5));
  }
  this->loss_detail = false;
  this->require_update = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Plotter::reparse_expr(size_t idx) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    auto& func = funcs[idx];
    func_error.clear();
    func.exprs.clear();
    std::string lhs, rhs;
    func.type = detect_func_type(use_latex ? latex_to_nivalis(func.expr_str) : func.expr_str, lhs, rhs);

    int ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
    bool want_reparse_all = false;
    switch(ftype_nomod) {
        case Function::FUNC_TYPE_EXPLICIT:
        case Function::FUNC_TYPE_EXPLICIT_Y:
        case Function::FUNC_TYPE_POLAR:
            func.expr = parse((rhs.size() == 1 &&
                            rhs[0] == result_var_name_for_type(func.type)) ?
                            lhs : rhs,
                        env,
                        true, // mode explicit
                        true, // quiet
                        0, &func_error);
            break;
        case Function::FUNC_TYPE_IMPLICIT:
            func.expr = parse("(" + lhs + ")-(" + rhs + ")",
                    env, true, true, 0, &func_error);
            break;
        case Function::FUNC_TYPE_GEOM_POLYLINE:
        case Function::FUNC_TYPE_GEOM_RECT:
            // This is either polyline or parametric
            {
                // New variable may have been registered implicitly:
                // (a,b) creates variables a,b
                // so possibly have to reparse all
                want_reparse_all = parse_polyline_expr(lhs, func, env,
                        x_var, y_var, t_var, func_error);
                if (ftype_nomod == Function::FUNC_TYPE_GEOM_RECT && func.exprs.size() != 4) {
                    func_error = "Illegal %rect. Syntax: %rect (ax, ay) (bx, by)\n";
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_CIRCLE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%circ radius/center not specified. Syntax: %circ radius @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.exprs.push_back(parse(lhs.substr(0, rad_end_pos), env, true, true, 0, &func_error));
                    if (func.exprs.size() != 3) {
                        func_error = "Illegal %circ. Syntax: %circ radius @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_ELLIPSE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%ellipse radius/center not specified. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    parse_polyline_expr(lhs.substr(0, rad_end_pos), func, env,
                            x_var, y_var, t_var, func_error);
                    if (func.exprs.size() != 4) {
                        func_error = "Illegal %ellipse. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_TEXT:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%text text/position not specified. Syntax: %text text @ (x, y)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.str = lhs.substr(0, rad_end_pos);
                    util::trim(func.str);
                    if (func.exprs.size() != 2) {
                        func_error = "Illegal %text. Syntax: %text text @ (x, y)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_FUNC_DEFINITION:
            {
                size_t funname_end = lhs.find('(');
                std::string funname = lhs.substr(0, funname_end);
                util::trim(funname);
                int64_t stkh = 0, last_begin = funname_end + 1;
                size_t argcount = 0, non_space_count = 0;
                std::vector<uint64_t> bindings;
                bool bad = false;
                for (int64_t i = funname_end + 1; i < lhs.size()- 1; ++i) {
                    const char cc = lhs[i];
                    if (cc == '(') {
                        ++stkh;
                    } else if (cc == ')') {
                        --stkh;
                    } else if (cc == ',') {
                        if (stkh == 0) {
                            std::string arg = lhs.substr(last_begin, i - last_begin);
                            util::trim(arg);
                            if (!util::is_varname(arg)) {
                                bad = true;
                                break;
                            }
                            auto addr = env.addr_of(arg, false);
                            bindings.push_back(addr);
                            last_begin = i+1;
                            ++argcount;
                        }
                    } else if (!std::isspace(cc)) {
                        ++non_space_count;
                    }
                }
                if (!bad && non_space_count) {
                    ++argcount;
                    std::string arg = lhs.substr(last_begin, lhs.size() - last_begin - 1);
                    util::trim(funname);
                    if (!util::is_varname(arg)) {
                        bad = true;
                    } else {
                        auto addr = env.addr_of(arg, false);
                        bindings.push_back(addr);
                    }
                } // else: function call with no args
                if (bad) {
                    func_error = "Invalid argument name in function definition " + lhs + "\n";
                } else {
                    Expr expr = parse(rhs, env, true, true, 0, &func_error);
                    if (env.addr_of_func(funname) == -1) {
                        // Since new function defined, other expressions may change meaning,
                        // so must reparse all
                        want_reparse_all = true;
                    }
                    auto addr = env.def_func(funname, expr, bindings);
                    if (env.error_msg.size()) {
                        func_error = env.error_msg;
                    }
                }
            }
            break;
    }

    if (!func.expr.is_null()) {
        // Optimize the main expression
        if (ftype_nomod != Function::FUNC_TYPE_PARAMETRIC &&
            ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION)
            func.expr.optimize();

        // Compute derivatives, if explicit
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
            ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
            func.diff = func.expr.diff(var, env);
            if (!func.diff.is_null()) {
                func.ddiff = func.diff.diff(var, env);
            }
            else func.ddiff.ast[0] = OpCode::null;
            func.recip = Expr::constant(1.) / func.expr;
            func.recip.optimize();
            func.drecip = func.recip.diff(var, env);
        }
    } else func.diff.ast[0] = OpCode::null;

    // Optimize any polyline/parametric point expressions
    for (auto& point_expr : func.exprs) {
        point_expr.optimize();
    }

    if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT
        || ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
        if (env.addr_of_func(func.name) == -1) {
            want_reparse_all = true;
        }
        // Register a function in env
        env.def_func(func.name, func.expr, { ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ? y_var : x_var });
        if (env.error_msg.size()) {
            func_error = env.error_msg;
        }
    } else if (ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION) {
        if (env.addr_of_func(func.name) != -1) {
            env.del_func(func.name);
            want_reparse_all = true;
        }
    }

    if (want_reparse_all) {
        // Possibly re-parse other expressions
        for (size_t i = 0; i < funcs.size(); ++i) {
            if (i != idx) {
                reparse_expr(i);
            }
        }
    }
    loss_detail = false;
    require_update = true;
}